

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_window.cpp
# Opt level: O2

void find_repeat_same_proc(Am_Object *cmd)

{
  Am_Value *pAVar1;
  Am_Wrapper *pAVar2;
  ostream *poVar3;
  Am_Object sel_widget;
  Am_Value_List old_val;
  Am_Value_List cmd_val;
  Am_Object local_30;
  Am_Value_List local_28;
  Am_Value_List local_18;
  
  pAVar1 = Am_Object::Get(cmd,0x169,0);
  Am_Value_List::Am_Value_List(&local_18,pAVar1);
  pAVar1 = Am_Object::Get(cmd,0x197,0);
  Am_Object::Am_Object(&local_30,pAVar1);
  pAVar1 = Am_Object::Get(&local_30,0x169,0);
  Am_Value_List::Am_Value_List(&local_28,pAVar1);
  pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_18);
  Am_Object::Set(&local_30,0x169,pAVar2,0);
  pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_28);
  Am_Object::Set(cmd,0x16c,pAVar2,0);
  if (am_sdebug == true) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Repeat Same Find, setting ");
    poVar3 = operator<<(poVar3,&local_30);
    poVar3 = std::operator<<(poVar3," to ");
    poVar3 = operator<<(poVar3,&local_18);
    poVar3 = std::operator<<(poVar3," instead of ");
    poVar3 = operator<<(poVar3,&local_28);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::ostream::flush();
  }
  Am_Value_List::~Am_Value_List(&local_28);
  Am_Object::~Am_Object(&local_30);
  Am_Value_List::~Am_Value_List(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, find_repeat_same, (Am_Object cmd))
{
  Am_Value_List cmd_val = cmd.Get(Am_VALUE);
  Am_Object sel_widget = cmd.Get(Am_SELECTION_WIDGET);
  Am_Value_List old_val = sel_widget.Get(Am_VALUE);
  sel_widget.Set(Am_VALUE, cmd_val);
  cmd.Set(Am_OLD_VALUE, old_val);
  if (am_sdebug)
    std::cout << "Repeat Same Find, setting " << sel_widget << " to " << cmd_val
              << " instead of " << old_val << std::endl
              << std::flush;
}